

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkfile_p.cpp
# Opt level: O1

void QNetworkFile::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QNetworkFile_to_subr *candidate;
  undefined8 *puVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  undefined4 local_3c;
  void *local_38;
  undefined4 *puStack_30;
  void *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 2) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        goto LAB_0018d047;
      }
    }
    else {
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
    goto LAB_0018d047;
  }
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((code *)*plVar1 == finished) && (uVar3 = 0, plVar1[1] == 0)) ||
        (((code *)*plVar1 == headerRead && (uVar3 = 1, plVar1[1] == 0)))) ||
       (((code *)*plVar1 == networkError && (uVar3 = 2, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar3;
    }
    goto LAB_0018d047;
  }
  if (_c != InvokeMetaMethod) goto LAB_0018d047;
  switch(_id) {
  case 0:
    local_3c = CONCAT31(local_3c._1_3_,*_a[1]);
    iVar4 = 0;
    break;
  case 1:
    local_28 = _a[2];
    local_3c = *_a[1];
    iVar4 = 1;
    break;
  case 2:
    local_28 = _a[2];
    local_3c = *_a[1];
    iVar4 = 2;
    break;
  case 3:
    open((QNetworkFile *)_o,(char *)CONCAT44(in_register_00000034,_c),_id);
    goto LAB_0018d047;
  case 4:
    (**(code **)(*(long *)_o + 0x70))();
  default:
    goto LAB_0018d047;
  }
  puStack_30 = &local_3c;
  local_38 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_38);
LAB_0018d047:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkFile::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkFile *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->headerRead((*reinterpret_cast< std::add_pointer_t<QHttpHeaders::WellKnownHeader>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2]))); break;
        case 2: _t->networkError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->open(); break;
        case 4: _t->close(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(bool )>(_a, &QNetworkFile::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(QHttpHeaders::WellKnownHeader , const QByteArray & )>(_a, &QNetworkFile::headerRead, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QNetworkFile::networkError, 2))
            return;
    }
}